

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

void __thiscall duckdb::StringStatisticsState::Update(StringStatisticsState *this,string_t *val)

{
  bool bVar1;
  bool bVar2;
  anon_union_16_2_67f50693_for_value local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (this->failed_truncate != false) {
    return;
  }
  if (this->has_stats == true) {
    string_t::string_t((string_t *)&local_48.pointer,&this->min);
    bVar1 = string_t::StringComparisonOperators::GreaterThan((string_t *)&local_48.pointer,val);
    if (bVar1) goto LAB_01f04e52;
  }
  else {
LAB_01f04e52:
    bVar1 = (val->value).pointer.length < 0x101;
    if (bVar1) {
      string_t::GetString_abi_cxx11_((string *)&local_48.pointer,val);
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_48.pointer);
      ::std::__cxx11::string::~string((string *)&local_48.pointer);
    }
    else {
      TruncateMin_abi_cxx11_((string *)&local_48.pointer,this,(string_t)(val->value).pointer,0x100);
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_48.pointer);
      ::std::__cxx11::string::~string((string *)&local_48.pointer);
    }
    this->min_truncated = !bVar1;
  }
  if (this->has_stats == true) {
    string_t::string_t((string_t *)&local_48.pointer,&this->max);
    bVar1 = string_t::StringComparisonOperators::GreaterThan(val,(string_t *)&local_48.pointer);
    if (!bVar1) goto LAB_01f04f92;
  }
  if ((val->value).pointer.length < 0x101) {
    string_t::GetString_abi_cxx11_((string *)&local_48.pointer,val);
    ::std::__cxx11::string::operator=((string *)&this->max,(string *)&local_48.pointer);
    ::std::__cxx11::string::~string((string *)&local_48.pointer);
    bVar1 = false;
  }
  else {
    bVar2 = TryTruncateMax(this,(string_t)(val->value).pointer,0x100,&this->max);
    bVar1 = true;
    if (!bVar2) {
      this->failed_truncate = true;
      this->has_stats = false;
      local_48.pointer.ptr = (char *)0x0;
      local_38._M_local_buf[0] = '\0';
      local_48._0_8_ = &local_38;
      ::std::__cxx11::string::operator=((string *)&this->min,(string *)&local_48.pointer);
      ::std::__cxx11::string::~string((string *)&local_48.pointer);
      local_48.pointer.ptr = (char *)0x0;
      local_38._M_local_buf[0] = '\0';
      local_48._0_8_ = &local_38;
      ::std::__cxx11::string::operator=((string *)&this->max,(string *)&local_48.pointer);
      ::std::__cxx11::string::~string((string *)&local_48.pointer);
      return;
    }
  }
  this->max_truncated = bVar1;
LAB_01f04f92:
  this->has_stats = true;
  return;
}

Assistant:

void Update(const string_t &val) {
		if (failed_truncate) {
			return;
		}
		if (!has_stats || LessThan::Operation(val, string_t(min))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				min = TruncateMin(val, MAX_STRING_STATISTICS_SIZE);
				min_truncated = true;
			} else {
				min = val.GetString();
				min_truncated = false;
			}
		}
		if (!has_stats || GreaterThan::Operation(val, string_t(max))) {
			if (val.GetSize() > MAX_STRING_STATISTICS_SIZE) {
				// string value exceeds our max string stats size - truncate
				if (!TryTruncateMax(val, MAX_STRING_STATISTICS_SIZE, max)) {
					// we failed to truncate - this can happen in some edge cases
					// skip stats for this column
					failed_truncate = true;
					has_stats = false;
					min = string();
					max = string();
					return;
				}
				max_truncated = true;
			} else {
				max = val.GetString();
				max_truncated = false;
			}
		}
		has_stats = true;
	}